

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

void __thiscall
duckdb_re2::NFA::AddToThreadq
          (NFA *this,Threadq *q,int id0,int c,StringPiece *context,char *p,Thread *t0)

{
  iterator *piVar1;
  ushort uVar2;
  AddState *pAVar3;
  IndexValue *pIVar4;
  Inst *pIVar5;
  bool bVar6;
  Thread *pTVar7;
  uint32_t uVar8;
  Thread **ppTVar9;
  ostream *poVar10;
  char **ppcVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
  i;
  Thread *pTVar15;
  _Elt_pointer pTVar16;
  ulong uVar17;
  ulong local_1f8;
  Thread *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (id0 != 0) {
    pAVar3 = (this->stack_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::NFA::AddState_*,_false>._M_head_impl;
    pAVar3->id = id0;
    pAVar3->t = (Thread *)0x0;
    local_1f8 = 1;
    do {
      local_1f8 = (ulong)((int)local_1f8 - 1);
      i._M_head_impl.len_ = (Deleter)pAVar3[local_1f8].id;
      pTVar15 = pAVar3[local_1f8].t;
      do {
        pTVar7 = t0;
        if ((pTVar15 != (Thread *)0x0) &&
           (iVar13 = (t0->field_0).ref, (t0->field_0).ref = iVar13 + -1, pTVar7 = pTVar15,
           iVar13 < 2)) {
          t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
          this->freelist_ = t0;
        }
        t0 = pTVar7;
        if (i._M_head_impl.len_ == 0) {
          i._M_head_impl.len_ = (Deleter)0;
LAB_004909b5:
          bVar6 = false;
          goto LAB_00490c38;
        }
        pIVar4 = (q->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                 .
                 super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                 ._M_head_impl;
        if ((((pIVar4 != (IndexValue *)0x0) &&
             ((uint)i._M_head_impl.len_ <
              (uint)*(int *)&(q->dense_).ptr_._M_t.
                             super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                             .
                             super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                             .
                             super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter,_false>
             )) && (uVar12 = (q->sparse_).ptr_._M_t.
                             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                             super__Head_base<0UL,_int_*,_false>._M_head_impl
                             [(int)i._M_head_impl.len_], uVar12 < (uint)q->size_)) &&
           ((Deleter)pIVar4[(int)uVar12].index_ == i._M_head_impl.len_)) goto LAB_004909b5;
        local_1b0 = (Thread *)0x0;
        bVar6 = false;
        SparseArray<duckdb_re2::NFA::Thread_*>::SetInternal
                  (q,false,(int)i._M_head_impl.len_,&local_1b0);
        ppTVar9 = &(q->dense_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                   .
                   super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                   ._M_head_impl
                   [(q->sparse_).ptr_._M_t.
                    super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                    super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)i._M_head_impl.len_]].
                   value_;
        pIVar5 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                 ((long)&(this->prog_->inst_).ptr_._M_t.
                         super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 + 8))->_M_head_impl;
        uVar12 = pIVar5[(int)i._M_head_impl.len_].out_opcode_;
        iVar13 = (int)local_1f8;
        switch(uVar12 & 7) {
        case 0:
          local_1b0 = (Thread *)((ulong)local_1b0 & 0xffffffffffffff00);
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"unhandled ",10);
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              (local_1a8,pIVar5[(int)i._M_head_impl.len_].out_opcode_ & 7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," in AddToThreadq",0x10);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
LAB_00490ac5:
          bVar6 = false;
          goto LAB_00490c38;
        case 1:
          (t0->field_0).ref = (t0->field_0).ref + 1;
          *ppTVar9 = t0;
LAB_00490ae8:
          i._M_head_impl.len_ = (Deleter)((int)i._M_head_impl.len_ + 1);
          break;
        case 2:
          uVar12 = c;
          if ((pIVar5[(int)i._M_head_impl.len_].field_1.out1_ & 0x10000) != 0) {
            uVar12 = c | 0x20;
          }
          if (0x19 < c - 0x41U) {
            uVar12 = c;
          }
          if (((int)uVar12 < (int)(uint)pIVar5[(int)i._M_head_impl.len_].field_1.byte_range.lo_) ||
             ((int)(uint)pIVar5[(int)i._M_head_impl.len_].field_1.byte_range.hi_ < (int)uVar12))
          goto LAB_00490ae0;
          (t0->field_0).ref = (t0->field_0).ref + 1;
          *ppTVar9 = t0;
          uVar2 = pIVar5[(int)i._M_head_impl.len_].field_1.byte_range.hint_foldcase_;
          if (uVar2 < 2) goto LAB_00490aef;
          i._M_head_impl.len_ = (Deleter)((int)i._M_head_impl.len_ + (uint)(uVar2 >> 1));
          break;
        case 3:
          if ((uVar12 & 8) == 0) {
            local_1f8 = (ulong)(iVar13 + 1);
            pAVar3[iVar13].id = (int)i._M_head_impl.len_ + 1;
            pAVar3[iVar13].t = (Thread *)0x0;
          }
          iVar13 = pIVar5[(int)i._M_head_impl.len_].field_1.cap_;
          if (iVar13 < this->ncapture_) {
            iVar14 = (int)local_1f8;
            pAVar3[iVar14].id = 0;
            pAVar3[iVar14].t = t0;
            pTVar15 = this->freelist_;
            if (pTVar15 == (Thread *)0x0) {
              pTVar16 = (this->arena_).
                        super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (pTVar16 ==
                  (this->arena_).
                  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>::
                _M_push_back_aux<>(&this->arena_);
              }
              else {
                (pTVar16->field_0).next = (Thread *)0x0;
                pTVar16->capture = (char **)0x0;
                piVar1 = &(this->arena_).
                          super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                          ._M_impl.super__Deque_impl_data._M_finish;
                piVar1->_M_cur = piVar1->_M_cur + 1;
              }
              pTVar16 = (this->arena_).
                        super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (pTVar16 ==
                  (this->arena_).
                  super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                pTVar16 = (this->arena_).
                          super__Deque_base<duckdb_re2::NFA::Thread,_std::allocator<duckdb_re2::NFA::Thread>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              pTVar15 = pTVar16 + -1;
              pTVar16[-1].field_0.ref = 1;
              uVar17 = (long)this->ncapture_ * 8;
              if ((long)this->ncapture_ < 0) {
                uVar17 = 0xffffffffffffffff;
              }
              ppcVar11 = (char **)operator_new__(uVar17);
              pTVar16[-1].capture = ppcVar11;
            }
            else {
              this->freelist_ = (Thread *)pTVar15->field_0;
              (pTVar15->field_0).ref = 1;
            }
            local_1f8 = (ulong)(iVar14 + 1);
            memmove(pTVar15->capture,t0->capture,(long)this->ncapture_ << 3);
            pTVar15->capture[iVar13] = p;
            t0 = pTVar15;
          }
          goto LAB_00490c23;
        case 4:
          if ((uVar12 & 8) == 0) {
            local_1f8 = (ulong)(iVar13 + 1);
            pAVar3[iVar13].id = (int)i._M_head_impl.len_ + 1;
            pAVar3[iVar13].t = (Thread *)0x0;
          }
          uVar12 = pIVar5[(int)i._M_head_impl.len_].field_1.out1_;
          uVar8 = Prog::EmptyFlags(context,p);
          if ((uVar12 & ~uVar8) != 0) goto LAB_00490ac5;
          i._M_head_impl.len_ = (Deleter)(pIVar5[(int)i._M_head_impl.len_].out_opcode_ >> 4);
          bVar6 = true;
          pTVar15 = (Thread *)0x0;
          goto LAB_00490c38;
        case 5:
          (t0->field_0).ref = (t0->field_0).ref + 1;
          *ppTVar9 = t0;
LAB_00490ae0:
          if ((pIVar5[(int)i._M_head_impl.len_].out_opcode_ & 8) == 0) goto LAB_00490ae8;
LAB_00490aef:
          bVar6 = false;
          goto switchD_00490943_caseD_7;
        case 6:
          if ((uVar12 & 8) == 0) {
            local_1f8 = (ulong)(iVar13 + 1);
            pAVar3[iVar13].id = (int)i._M_head_impl.len_ + 1;
            pAVar3[iVar13].t = (Thread *)0x0;
          }
LAB_00490c23:
          i._M_head_impl.len_ = (Deleter)(pIVar5[(int)i._M_head_impl.len_].out_opcode_ >> 4);
          break;
        case 7:
          goto switchD_00490943_caseD_7;
        }
        bVar6 = true;
        pTVar15 = (Thread *)0x0;
switchD_00490943_caseD_7:
LAB_00490c38:
      } while (bVar6);
    } while (0 < (int)local_1f8);
  }
  return;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, const StringPiece& context,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = {id0, NULL};
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);
    Thread** tp = &q->get_existing(id);
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = {id+1, NULL};
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on.
      a = {ip->out(), NULL};
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = {0, t0};

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = {ip->out(), NULL};
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;

      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      if (ip->hint() == 0)
        break;
      a = {id+ip->hint(), NULL};
      goto Loop;

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

    Next:
      if (ip->last())
        break;
      a = {id+1, NULL};
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~Prog::EmptyFlags(context, p))
        break;
      a = {ip->out(), NULL};
      goto Loop;
    }
  }
}